

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void luaH_resize(lua_State *L,Table *t,uint nasize,uint nhsize)

{
  uint uVar1;
  Node *block;
  undefined4 uVar2;
  TValue *pTVar3;
  Node *pNVar4;
  int local_4c;
  TValue *io1;
  Node *old;
  Node *nold;
  int oldhsize;
  uint oldasize;
  int j;
  uint i;
  uint nhsize_local;
  uint nasize_local;
  Table *t_local;
  lua_State *L_local;
  
  uVar1 = t->sizearray;
  if (t->lastfree == (Node *)0x0) {
    local_4c = 0;
  }
  else {
    local_4c = 1 << (t->lsizenode & 0x1f);
  }
  block = t->node;
  if (uVar1 < nasize) {
    setarrayvector(L,t,nasize);
  }
  setnodevector(L,t,nhsize);
  oldhsize = local_4c;
  if (nasize < uVar1) {
    t->sizearray = nasize;
    for (oldasize = nasize; oldasize < uVar1; oldasize = oldasize + 1) {
      if (t->array[oldasize].tt_ != 0) {
        luaH_setint(L,t,(ulong)(oldasize + 1),t->array + oldasize);
      }
    }
    pTVar3 = (TValue *)luaM_realloc_(L,t->array,(ulong)uVar1 << 4,(ulong)nasize << 4);
    t->array = pTVar3;
  }
  while (oldhsize = oldhsize + -1, -1 < oldhsize) {
    pNVar4 = block + oldhsize;
    if ((pNVar4->i_val).tt_ != 0) {
      pTVar3 = luaH_set(L,t,&(pNVar4->i_key).tvk);
      pTVar3->value_ = (pNVar4->i_val).value_;
      uVar2 = *(undefined4 *)&(pNVar4->i_val).field_0xc;
      pTVar3->tt_ = (pNVar4->i_val).tt_;
      *(undefined4 *)&pTVar3->field_0xc = uVar2;
    }
  }
  if (0 < local_4c) {
    luaM_realloc_(L,block,(long)local_4c << 5,0);
  }
  return;
}

Assistant:

void luaH_resize(lua_State *L, Table *t, unsigned int nasize,
                 unsigned int nhsize) {
    unsigned int i;
    int j;
    unsigned int oldasize = t->sizearray;
    int oldhsize = allocsizenode(t);
    Node *nold = t->node;  /* save old hash ... */
    if (nasize > oldasize)  /* array part must grow? */
        setarrayvector(L, t, nasize);
    /* create new hash part with appropriate size */
    setnodevector(L, t, nhsize);
    if (nasize < oldasize) {  /* array part must shrink? */
        t->sizearray = nasize;
        /* re-insert elements from vanishing slice */
        for (i = nasize; i < oldasize; i++) {
            if (!ttisnil(&t->array[i]))
                luaH_setint(L, t, i + 1, &t->array[i]);
        }
        /* shrink array */
        luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
    }
    /* re-insert elements from hash part */
    for (j = oldhsize - 1; j >= 0; j--) {
        Node *old = nold + j;
        if (!ttisnil(gval(old))) {
            /* doesn't need barrier/invalidate cache, as entry was
               already present in the table */
            setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
        }
    }
    if (oldhsize > 0)  /* not the dummy node? */
        luaM_freearray(L, nold, cast(size_t, oldhsize)); /* free old hash */
}